

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bssplitscb(bStream *s,const_bstring splitStr,_func_int_void_ptr_int_const_bstring *cb,void *parm
              )

{
  byte bVar1;
  uchar uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  bstring r;
  int iVar6;
  charField chrs;
  int local_68;
  charField local_50;
  
  uVar5 = 0xffffffff;
  if ((((s != (bStream *)0x0 && cb != (_func_int_void_ptr_int_const_bstring *)0x0) &&
       (splitStr != (const_bstring)0x0)) && (s->readFnPtr != (bNread)0x0)) &&
     ((-1 < splitStr->slen && (r = bfromcstr(anon_var_dwarf_350e4 + 0x10), r != (bstring)0x0)))) {
    if (splitStr->slen != 0) {
      buildCharField(&local_50,splitStr);
      iVar6 = 0;
      local_68 = 0;
      do {
        if ((r->slen <= iVar6) && (bsreada(r,s,0x100), r->slen <= iVar6)) goto LAB_00152014;
        bVar1 = r->data[iVar6];
        if ((local_50.content[bVar1 >> 3] >> (bVar1 & 7) & 1) != 0) {
          uVar5 = 0xffffffff;
          if (s->buff == (bstring)0x0) {
LAB_00151fe0:
            bVar3 = false;
          }
          else {
            bVar3 = false;
            iVar4 = binsertblk(s->buff,0,r->data + (long)iVar6 + 1,r->slen - (iVar6 + 1),'?');
            if (-1 < iVar4) {
              r->slen = iVar6;
              uVar2 = r->data[iVar6];
              r->data[iVar6] = '\0';
              uVar5 = (*cb)(parm,local_68,r);
              if ((int)uVar5 < 0) goto LAB_00151fe0;
              r->data[iVar6] = uVar2;
              r->slen = 0;
              local_68 = local_68 + iVar6 + 1;
              bVar3 = true;
              iVar6 = -1;
            }
          }
          if (!bVar3) goto LAB_00152026;
        }
        iVar6 = iVar6 + 1;
      } while( true );
    }
    do {
      iVar6 = bsreada(r,s,0x100);
    } while (-1 < iVar6);
    local_68 = 0;
LAB_00152014:
    uVar5 = (*cb)(parm,local_68,r);
    uVar5 = (int)uVar5 >> 0x1f & uVar5;
LAB_00152026:
    bdestroy(r);
  }
  return uVar5;
}

Assistant:

int bssplitscb (struct bStream * s, const_bstring splitStr,
	int (* cb) (void * parm, int ofs, const_bstring entry), void * parm) {
	struct charField chrs;
	bstring buff;
	int i = 0, p = 0, ret = 0;

	if (cb == NULL || s == NULL || s->readFnPtr == NULL ||
	    splitStr == NULL || splitStr->slen < 0) return BSTR_ERR;

	if (NULL == (buff = bfromcstr (""))) return BSTR_ERR;

	if (splitStr->slen == 0) {
		while (bsreada (buff, s, BSSSC_BUFF_LEN) >= 0) ;
		if ((ret = cb (parm, 0, buff)) > 0)
			ret = 0;
	} else {
		buildCharField (&chrs, splitStr);
		for (;;) {
			if (i >= buff->slen) {
				bsreada (buff, s, BSSSC_BUFF_LEN);
				if (i >= buff->slen) {
					if (0 < (ret = cb (parm, p, buff))) ret = 0;
					break;
				}
			}
			if (testInCharField (&chrs, buff->data[i])) {
				struct tagbstring t;
				unsigned char c;

				blk2tbstr (t, buff->data + i + 1, buff->slen - (i + 1));
				if ((ret = bsunread (s, &t)) < 0) break;
				buff->slen = i;
				c = buff->data[i];
				buff->data[i] = (unsigned char) '\0';
				if ((ret = cb (parm, p, buff)) < 0) break;
				buff->data[i] = c;
				buff->slen = 0;
				p += i + 1;
				i = -1;
			}
			i++;
		}
	}

	bdestroy (buff);
	return ret;
}